

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

SamplerType glu::TextureTestUtil::getFetchSamplerType(TextureFormat format)

{
  ChannelOrder local_14;
  ChannelType CStack_10;
  TextureFormat format_local;
  
  CStack_10 = format.type;
  if (CStack_10 != UNSIGNED_INT_1010102_REV) {
    if (CStack_10 == UNSIGNED_INT_24_8) {
LAB_0103840c:
      local_14 = format.order;
      if (local_14 != D && local_14 != DS) {
        return SAMPLERTYPE_FETCH_UINT;
      }
      return SAMPLERTYPE_FETCH_FLOAT;
    }
    if (CStack_10 - SIGNED_INT8 < 3) {
      return SAMPLERTYPE_FETCH_INT;
    }
    if (CStack_10 != UNSIGNED_INT8) {
      if (CStack_10 == UNSIGNED_INT16) goto LAB_0103840c;
      if (CStack_10 != UNSIGNED_INT32) {
        return SAMPLERTYPE_FETCH_FLOAT;
      }
    }
  }
  return SAMPLERTYPE_FETCH_UINT;
}

Assistant:

SamplerType getFetchSamplerType (tcu::TextureFormat format)
{
	using tcu::TextureFormat;

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:
		case TextureFormat::SIGNED_INT16:
		case TextureFormat::SIGNED_INT32:
			return SAMPLERTYPE_FETCH_INT;

		case TextureFormat::UNSIGNED_INT8:
		case TextureFormat::UNSIGNED_INT32:
		case TextureFormat::UNSIGNED_INT_1010102_REV:
			return SAMPLERTYPE_FETCH_UINT;

		// Texture formats used in depth/stencil textures.
		case TextureFormat::UNSIGNED_INT16:
		case TextureFormat::UNSIGNED_INT_24_8:
			return (format.order == TextureFormat::D || format.order == TextureFormat::DS) ? SAMPLERTYPE_FETCH_FLOAT : SAMPLERTYPE_FETCH_UINT;

		default:
			return SAMPLERTYPE_FETCH_FLOAT;
	}
}